

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMesh::GetEdgeCenterPointAndNormal
          (ON_SubDMesh *this,ON_SubDEdge *edge,uint edge_face_index,double *P,double *N)

{
  byte bVar1;
  uint *puVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ON_SubDFace *this_00;
  ON_SubDMeshFragment *this_01;
  ON_SubDEdge *pOVar9;
  ON_SubDVertex *pOVar10;
  ON__UINT_PTR OVar11;
  ON_SubDVertex *pOVar12;
  long lVar13;
  long lVar14;
  uint grid_side_index;
  uint local_48;
  
  dVar5 = ON_DBL_QNAN;
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = dVar5;
    P[2] = dVar5;
  }
  dVar5 = ON_DBL_QNAN;
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = dVar5;
    N[2] = dVar5;
  }
  if ((edge != (ON_SubDEdge *)0x0) &&
     (this_00 = ON_SubDEdge::Face(edge,edge_face_index), this_00 != (ON_SubDFace *)0x0)) {
    uVar7 = ON_SubDFace::EdgeArrayIndex(this_00,edge);
    uVar8 = ON_SubDFace::EdgeCount(this_00);
    if (uVar7 < uVar8) {
      for (this_01 = FaceFragment(this,this_00); this_01 != (ON_SubDMeshFragment *)0x0;
          this_01 = this_01->m_next_fragment) {
        if (this_01->m_face != this_00) {
          uVar8 = 0xffffffff;
LAB_0060c1d7:
          uVar7 = ON_SubDMeshFragment::PointCount(this_01);
          if (uVar7 <= uVar8) {
            return false;
          }
          lVar14 = this_01->m_N_stride * (ulong)uVar8;
          pdVar3 = this_01->m_N;
          if (P != (double *)0x0) {
            pdVar4 = this_01->m_P;
            lVar13 = (ulong)uVar8 * this_01->m_P_stride;
            *P = pdVar4[lVar13];
            P[1] = pdVar4[lVar13 + 1];
            P[2] = pdVar4[lVar13 + 2];
          }
          if (N != (double *)0x0) {
            *N = pdVar3[lVar14];
            N[1] = pdVar3[lVar14 + 1];
            N[2] = pdVar3[lVar14 + 2];
            return true;
          }
          return true;
        }
        bVar6 = ON_SubDMeshFragment::IsFaceCornerFragment(this_01);
        for (grid_side_index = 0; grid_side_index != 4; grid_side_index = grid_side_index + 1) {
          pOVar9 = ON_SubDMeshFragment::SubDEdge(this_01,grid_side_index);
          if (pOVar9 == edge) {
            bVar1 = (this_01->m_grid).m_side_segment_count;
            uVar8 = 0xffffffff;
            if ((bVar1 == 0) || (puVar2 = (this_01->m_grid).m_S, puVar2 == (uint *)0x0))
            goto LAB_0060c1b9;
            if (bVar6) {
              pOVar10 = ON_SubDMeshFragment::SubDVertex(this_01,grid_side_index);
              uVar8 = 0xffffffff;
              if (pOVar10 != (ON_SubDVertex *)0x0) {
                OVar11 = ON_SubDFace::EdgeDirection(this_00,uVar7);
                pOVar12 = ON_SubDEdge::Vertex(edge,(uint)(OVar11 != 0));
                local_48 = (uint)bVar1;
                uVar8 = (this_01->m_grid).m_S[((pOVar10 == pOVar12) + grid_side_index) * local_48];
              }
              goto LAB_0060c1b9;
            }
            bVar6 = ON_SubDMeshFragment::IsFullFaceFragment(this_01);
            uVar8 = 0xffffffff;
            if (bVar6) {
              uVar8 = puVar2[(uint)(bVar1 >> 1) + grid_side_index * bVar1];
            }
            goto LAB_0060c1d7;
          }
        }
        uVar8 = 0xffffffff;
LAB_0060c1b9:
        if (!bVar6 || uVar8 != 0xffffffff) goto LAB_0060c1d7;
      }
    }
  }
  return false;
}

Assistant:

bool ON_SubDMesh::GetEdgeCenterPointAndNormal(
  const class ON_SubDEdge* edge,
  unsigned int edge_face_index,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  if (nullptr == edge)
    return false;
  const ON_SubDFace* face = edge->Face(edge_face_index);
  if (nullptr == face)
    return false;
  const unsigned int fei = face->EdgeArrayIndex(edge);
  if (fei >= face->EdgeCount())
    return false;

  unsigned int P_dex = ON_UNSET_UINT_INDEX;

  bool bIsPartialFragment = false;
  const ON_SubDMeshFragment* fragment = nullptr;
  for (
    fragment =  FaceFragment(face);
    nullptr != fragment && fragment->m_face == face;
    fragment = bIsPartialFragment ? fragment->m_next_fragment : nullptr
    )
  {
    bIsPartialFragment = fragment->IsFaceCornerFragment();
    for (unsigned int grid_side_index = 0; grid_side_index < 4; grid_side_index++)
    {
      const ON_SubDEdge* grid_side_edge = fragment->SubDEdge(grid_side_index);
      if (edge != grid_side_edge)
        continue;
      const unsigned int n = fragment->m_grid.m_side_segment_count;
      if (n <= 0 || nullptr == fragment->m_grid.m_S)
        break;
      if (bIsPartialFragment)
      {
        const ON_SubDVertex* v = fragment->SubDVertex(grid_side_index);
        if (nullptr != v)
        {
          const unsigned int evi = (0 == face->EdgeDirection(fei)) ? 0U : 1U;
          if (v == edge->Vertex(evi))
            grid_side_index++;
          P_dex = fragment->m_grid.m_S[grid_side_index*n];
        }
      }
      else if (fragment->IsFullFaceFragment())
      {
        P_dex = fragment->m_grid.m_S[grid_side_index*n + n / 2];
      }
      break;
    }
    if (false == bIsPartialFragment || ON_UNSET_UINT_INDEX != P_dex)
      break;
  }
  if (nullptr == fragment)
    return false;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}